

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O2

int CheckExts(tchar_t *URL,tchar_t *Exts)

{
  int iVar1;
  char *pcVar2;
  size_t n;
  tchar_t Ext [256];
  
  SplitPath(URL,(tchar_t *)0x0,0,(tchar_t *)0x0,0,Ext,0x100);
  pcVar2 = strchr(Ext,0x3f);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
  }
  n = strlen(Ext);
  while( true ) {
    if (Exts == (char *)0x0) {
      return 0;
    }
    pcVar2 = strchr(Exts,0x3a);
    if ((n == (long)pcVar2 - (long)Exts && pcVar2 != (char *)0x0) &&
       (iVar1 = tcsnicmp(Ext,Exts,n), iVar1 == 0)) break;
    pcVar2 = strchr(Exts,0x3b);
    Exts = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      Exts = (char *)0x0;
    }
  }
  return (int)pcVar2[1];
}

Assistant:

int CheckExts(const tchar_t* URL, const tchar_t* Exts)
{
    tchar_t Ext[MAXPATH];
    tchar_t* Tail;
    intptr_t ExtLen;

    SplitPath(URL,NULL,0,NULL,0,Ext,TSIZEOF(Ext));
    Tail = tcschr(Ext,'?');
    if (Tail) *Tail = 0;
    ExtLen = tcslen(Ext);

    while (Exts)
    {
        const tchar_t* p = tcschr(Exts,':');
        if (p && (ExtLen == p-Exts) && tcsnicmp(Ext,Exts,p-Exts)==0)
            return p[1]; // return type char
        Exts = tcschr(Exts,';');
        if (Exts) ++Exts;
    }
    return 0;
}